

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cpp
# Opt level: O3

tokens Ident::TkFromNameLen
                 (uint32 luHash,LPCOLESTR prgch,uint32 cch,bool isStrictMode,ushort *pgrfid,
                 ushort *ptk)

{
  int iVar1;
  uint uVar2;
  tokens tVar3;
  tokens tVar4;
  
  if (luHash < 0x9ff239) {
    if (0x8caba < luHash) {
      if (luHash == 0x8cabb) {
        if (cch != 4) {
          return tkID;
        }
        iVar1 = bcmp(g_ssym_null.sz,prgch,8);
        if (iVar1 != 0) {
          return tkID;
        }
        *(byte *)pgrfid = (byte)*pgrfid | 1;
        *ptk = 0x26;
        return tkNULL;
      }
      if (0x89c56a < luHash) {
        if (luHash == 0x89c56b) {
          if (cch != 5) {
            return tkID;
          }
          iVar1 = bcmp(g_ssym_false.sz,prgch,10);
          if (iVar1 != 0) {
            return tkID;
          }
          *(byte *)pgrfid = (byte)*pgrfid | 1;
          *ptk = 0x14;
          return tkFALSE;
        }
        if (0x9ae06f < luHash) {
          if (luHash == 0x9ae070) {
            if (cch != 5) {
              return tkID;
            }
            iVar1 = bcmp(g_ssym_short.sz,prgch,10);
            if (iVar1 != 0) {
              return tkID;
            }
            *ptk = 0x2b;
            return tkID;
          }
          if (luHash < 0x9c29e4) {
            if (luHash != 0x9bda2f) {
              return tkID;
            }
            if (cch != 5) {
              return tkID;
            }
            iVar1 = bcmp(g_ssym_super.sz,prgch,10);
            if (iVar1 != 0) {
              return tkID;
            }
            *(byte *)pgrfid = (byte)*pgrfid | 1;
            *ptk = 0x43;
            return tkSUPER;
          }
          if (luHash == 0x9c29e4) {
            if (cch != 5) {
              return tkID;
            }
            iVar1 = bcmp(g_ssym_throw.sz,prgch,10);
            if (iVar1 != 0) {
              return tkID;
            }
            *(byte *)pgrfid = (byte)*pgrfid | 1;
            *ptk = 0x2f;
            return tkTHROW;
          }
          if (luHash != 0x9db965) {
            return tkID;
          }
          if (cch != 5) {
            return tkID;
          }
          iVar1 = bcmp(g_ssym_ulong.sz,prgch,10);
          if (iVar1 != 0) {
            return tkID;
          }
          *ptk = 0x36;
          return tkID;
        }
        if (0x8a9ac5 < luHash) {
          if (luHash == 0x8a9ac6) {
            if (cch != 5) {
              return tkID;
            }
            iVar1 = bcmp(g_ssym_float.sz,prgch,10);
            if (iVar1 != 0) {
              return tkID;
            }
            *ptk = 0x17;
            return tkID;
          }
          if (luHash != 0x9a78a7) {
            return tkID;
          }
          if (cch != 5) {
            return tkID;
          }
          iVar1 = bcmp(g_ssym_sbyte.sz,prgch,10);
          if (iVar1 != 0) {
            return tkID;
          }
          *ptk = 0x29;
          return tkID;
        }
        if (luHash == 0x8a0a02) {
          if (cch != 5) {
            return tkID;
          }
          iVar1 = bcmp(g_ssym_event.sz,prgch,10);
          if (iVar1 != 0) {
            return tkID;
          }
          *ptk = 0x13;
          return tkID;
        }
        if (luHash != 0x8a600a) {
          return tkID;
        }
        if (cch != 5) {
          return tkID;
        }
        iVar1 = bcmp(g_ssym_final.sz,prgch,10);
        if (iVar1 != 0) {
          return tkID;
        }
        *ptk = 0x15;
        return tkID;
      }
      if (0x96a6b < luHash) {
        if (luHash == 0x96a6c) {
          if (cch != 4) {
            return tkID;
          }
          iVar1 = bcmp(g_ssym_with.sz,prgch,8);
          if (iVar1 != 0) {
            return tkID;
          }
          *(byte *)pgrfid = (byte)*pgrfid | 1;
          *ptk = 0x3d;
          return tkWITH;
        }
        if (luHash < 0x86b966) {
          if (luHash == 0x84ff56) {
            if (cch != 5) {
              return tkID;
            }
            iVar1 = bcmp(g_ssym_await.sz,prgch,10);
            if (iVar1 != 0) {
              return tkID;
            }
            *(byte *)pgrfid = (byte)*pgrfid | 1;
            *ptk = 3;
            return tkAWAIT;
          }
          if (luHash != 0x85e995) {
            if (luHash != 0x85faa3) {
              return tkID;
            }
            if (cch != 5) {
              return tkID;
            }
            iVar1 = bcmp(g_ssym_catch.sz,prgch,10);
            if (iVar1 != 0) {
              return tkID;
            }
            *(byte *)pgrfid = (byte)*pgrfid | 1;
            *ptk = 8;
            return tkCATCH;
          }
          if (cch != 5) {
            return tkID;
          }
          iVar1 = bcmp(g_ssym_break.sz,prgch,10);
          if (iVar1 != 0) {
            return tkID;
          }
          *(byte *)pgrfid = (byte)*pgrfid | 1;
          *ptk = 5;
          return tkBREAK;
        }
        if (luHash == 0x86b966) {
          if (cch != 5) {
            return tkID;
          }
          iVar1 = bcmp(g_ssym_class.sz,prgch,10);
          if (iVar1 != 0) {
            return tkID;
          }
          *(byte *)pgrfid = (byte)*pgrfid | 1;
          *ptk = 0x3e;
          return tkCLASS;
        }
        if (luHash != 0x8701a7) {
          return tkID;
        }
        if (cch != 5) {
          return tkID;
        }
        iVar1 = bcmp(g_ssym_const.sz,prgch,10);
        if (iVar1 != 0) {
          return tkID;
        }
        *(byte *)pgrfid = (byte)*pgrfid | 1;
        *ptk = 0x3f;
        return tkCONST;
      }
      if (luHash < 0x943b0) {
        if (luHash == 0x92f08) {
          if (cch != 4) {
            return tkID;
          }
          iVar1 = bcmp(g_ssym_this.sz,prgch,8);
          if (iVar1 != 0) {
            return tkID;
          }
          *(byte *)pgrfid = (byte)*pgrfid | 1;
          *ptk = 0x2e;
          return tkTHIS;
        }
        if (luHash != 0x93b10) {
          return tkID;
        }
        if (cch != 4) {
          return tkID;
        }
        iVar1 = bcmp(g_ssym_true.sz,prgch,8);
        if (iVar1 != 0) {
          return tkID;
        }
        *(byte *)pgrfid = (byte)*pgrfid | 1;
        *ptk = 0x32;
        return tkTRUE;
      }
      if (luHash == 0x943b0) {
        if (cch != 4) {
          return tkID;
        }
        iVar1 = bcmp(g_ssym_uint.sz,prgch,8);
        if (iVar1 != 0) {
          return tkID;
        }
        *ptk = 0x35;
        return tkID;
      }
      if (luHash != 0x95d42) {
        return tkID;
      }
      if (cch != 4) {
        return tkID;
      }
      iVar1 = bcmp(g_ssym_void.sz,prgch,8);
      if (iVar1 != 0) {
        return tkID;
      }
      *(byte *)pgrfid = (byte)*pgrfid | 1;
      *ptk = 0x3a;
      return tkVOID;
    }
    if (0x8afe < luHash) {
      if (luHash == 0x8aff) {
        if (cch != 3) {
          return tkID;
        }
        iVar1 = bcmp(g_ssym_try.sz,prgch,6);
        if (iVar1 != 0) {
          return tkID;
        }
        *(byte *)pgrfid = (byte)*pgrfid | 1;
        *ptk = 0x33;
        return tkTRY;
      }
      if (0x7e973 < luHash) {
        if (luHash == 0x7e974) {
          if (cch != 4) {
            return tkID;
          }
          iVar1 = bcmp(g_ssym_byte.sz,prgch,8);
          if (iVar1 != 0) {
            return tkID;
          }
          *ptk = 6;
          return tkID;
        }
        if (luHash < 0x83e29) {
          if (luHash == 0x81449) {
            if (cch != 4) {
              return tkID;
            }
            iVar1 = bcmp(g_ssym_else.sz,prgch,8);
            if (iVar1 != 0) {
              return tkID;
            }
            *(byte *)pgrfid = (byte)*pgrfid | 1;
            *ptk = 0x11;
            return tkELSE;
          }
          if (luHash != 0x816b5) {
            return tkID;
          }
          if (cch != 4) {
            return tkID;
          }
          iVar1 = bcmp(g_ssym_enum.sz,prgch,8);
          if (iVar1 != 0) {
            return tkID;
          }
          *(byte *)pgrfid = (byte)*pgrfid | 1;
          *ptk = 0x45;
          return tkENUM;
        }
        if (luHash == 0x83e29) {
          if (cch != 4) {
            return tkID;
          }
          iVar1 = bcmp(g_ssym_goto.sz,prgch,8);
          if (iVar1 != 0) {
            return tkID;
          }
          *ptk = 0x1b;
          return tkID;
        }
        if (luHash != 0x89db0) {
          return tkID;
        }
        if (cch != 4) {
          return tkID;
        }
        iVar1 = bcmp(g_ssym_long.sz,prgch,8);
        if (iVar1 != 0) {
          return tkID;
        }
        *ptk = 0x22;
        return tkID;
      }
      if (0x7e17b < luHash) {
        if (luHash == 0x7e17c) {
          if (cch != 4) {
            return tkID;
          }
          iVar1 = bcmp(g_ssym_case.sz,prgch,8);
          if (iVar1 != 0) {
            return tkID;
          }
          *(byte *)pgrfid = (byte)*pgrfid | 1;
          *ptk = 7;
          return tkCASE;
        }
        if (luHash != 0x7e83e) {
          return tkID;
        }
        if (cch != 4) {
          return tkID;
        }
        iVar1 = bcmp(g_ssym_char.sz,prgch,8);
        if (iVar1 != 0) {
          return tkID;
        }
        *ptk = 9;
        return tkID;
      }
      if (luHash == 0x8c19) {
        if (cch != 3) {
          return tkID;
        }
        iVar1 = bcmp(g_ssym_var.sz,prgch,6);
        if (iVar1 != 0) {
          return tkID;
        }
        *(byte *)pgrfid = (byte)*pgrfid | 1;
        *ptk = 0x39;
        return tkVAR;
      }
      if (luHash != 0x8c1d) {
        return tkID;
      }
      if (cch != 3) {
        return tkID;
      }
      iVar1 = bcmp(g_ssym_use.sz,prgch,6);
      if (iVar1 != 0) {
        return tkID;
      }
      *ptk = 0x37;
      return tkID;
    }
    if (luHash < 0x7b70) {
      if (0x766 < luHash) {
        if (luHash == 0x767) {
          if (cch != 2) {
            return tkID;
          }
          iVar1 = bcmp(g_ssym_in.sz,prgch,4);
          if (iVar1 != 0) {
            return tkID;
          }
          *(byte *)pgrfid = (byte)*pgrfid | 1;
          *ptk = 0x1d;
          return tkIN;
        }
        if (luHash != 0x7af7) {
          return tkID;
        }
        if (cch != 3) {
          return tkID;
        }
        iVar1 = bcmp(g_ssym_for.sz,prgch,6);
        if (iVar1 != 0) {
          return tkID;
        }
        *(byte *)pgrfid = (byte)*pgrfid | 1;
        *ptk = 0x18;
        return tkFOR;
      }
      if (luHash == 0x713) {
        if (cch != 2) {
          return tkID;
        }
        iVar1 = bcmp(g_ssym_do.sz,prgch,4);
        if (iVar1 != 0) {
          return tkID;
        }
        *(byte *)pgrfid = (byte)*pgrfid | 1;
        *ptk = 0xf;
        return tkDO;
      }
      if (luHash != 0x75f) {
        return tkID;
      }
      if (cch != 2) {
        return tkID;
      }
      iVar1 = bcmp(g_ssym_if.sz,prgch,4);
      if (iVar1 != 0) {
        return tkID;
      }
      *(byte *)pgrfid = (byte)*pgrfid | 1;
      *ptk = 0x1c;
      return tkIF;
    }
    if (luHash == 0x7b70) {
      if (cch != 3) {
        return tkID;
      }
      iVar1 = bcmp(g_ssym_get.sz,prgch,6);
      if (iVar1 != 0) {
        return tkID;
      }
      *ptk = 0x1a;
      return tkID;
    }
    uVar2 = luHash & 0xffff;
    if (0x8359 < luHash) {
      if (uVar2 == 0x835a) {
        if (cch != 3) {
          return tkID;
        }
        iVar1 = bcmp(g_ssym_new.sz,prgch,6);
        if (iVar1 != 0) {
          return tkID;
        }
        *(byte *)pgrfid = (byte)*pgrfid | 1;
        *ptk = 0x25;
        return tkNEW;
      }
      if (uVar2 != 0x88fc) {
        return tkID;
      }
      if (cch != 3) {
        return tkID;
      }
      iVar1 = bcmp(g_ssym_set.sz,prgch,6);
      if (iVar1 != 0) {
        return tkID;
      }
      *ptk = 0x2a;
      return tkID;
    }
    if (uVar2 == 0x7e4b) {
      if (cch != 3) {
        return tkID;
      }
      iVar1 = bcmp(g_ssym_int.sz,prgch,6);
      if (iVar1 != 0) {
        return tkID;
      }
      *ptk = 0x1f;
      return tkID;
    }
    if (uVar2 != 0x8115) {
      return tkID;
    }
    if (cch != 3) {
      return tkID;
    }
    iVar1 = bcmp(g_ssym_let.sz,prgch,6);
    if (iVar1 != 0) {
      return tkID;
    }
    *(byte *)pgrfid = (byte)*pgrfid | 2;
    *ptk = 0x48;
    tVar3 = tkLET;
  }
  else {
    if (luHash == 0x9ff239) {
      if (cch != 5) {
        return tkID;
      }
      iVar1 = bcmp(g_ssym_while.sz,prgch,10);
      if (iVar1 != 0) {
        return tkID;
      }
      *(byte *)pgrfid = (byte)*pgrfid | 1;
      *ptk = 0x3c;
      return tkWHILE;
    }
    if (luHash < 0x70e47cd6) {
      if (0xa2fcdff < luHash) {
        if (luHash == 0xa2fce00) {
          if (cch != 6) {
            return tkID;
          }
          iVar1 = bcmp(g_ssym_return.sz,prgch,0xc);
          if (iVar1 != 0) {
            return tkID;
          }
          *(byte *)pgrfid = (byte)*pgrfid | 1;
          *ptk = 0x28;
          return tkRETURN;
        }
        if (0xa81b774 < luHash) {
          if (luHash == 0xa81b775) {
            if (cch != 6) {
              return tkID;
            }
            iVar1 = bcmp(g_ssym_ushort.sz,prgch,0xc);
            if (iVar1 != 0) {
              return tkID;
            }
            *ptk = 0x38;
            return tkID;
          }
          if (luHash < 0x2806f445) {
            if (luHash != 0x1ef7ad75) {
              return tkID;
            }
            if (cch != 8) {
              return tkID;
            }
            iVar1 = bcmp(g_ssym_continue.sz,prgch,0x10);
            if (iVar1 != 0) {
              return tkID;
            }
            *(byte *)pgrfid = (byte)*pgrfid | 1;
            *ptk = 10;
            return tkCONTINUE;
          }
          if (luHash == 0x2806f445) {
            if (cch != 8) {
              return tkID;
            }
            iVar1 = bcmp(g_ssym_debugger.sz,prgch,0x10);
            if (iVar1 != 0) {
              return tkID;
            }
            *(byte *)pgrfid = (byte)*pgrfid | 1;
            *ptk = 0xb;
            return tkDEBUGGER;
          }
          if (luHash != 0x3189c9e0) {
            return tkID;
          }
          if (cch != 0xc) {
            return tkID;
          }
          iVar1 = bcmp(g_ssym_synchronized.sz,prgch,0x18);
          if (iVar1 != 0) {
            return tkID;
          }
          *ptk = 0x2d;
          return tkID;
        }
        if (0xa5ec896 < luHash) {
          if (luHash == 0xa5ec897) {
            if (cch != 6) {
              return tkID;
            }
            iVar1 = bcmp(g_ssym_throws.sz,prgch,0xc);
            if (iVar1 != 0) {
              return tkID;
            }
            *ptk = 0x30;
            return tkID;
          }
          if (luHash != 0xa7440a7) {
            return tkID;
          }
          if (cch != 6) {
            return tkID;
          }
          iVar1 = bcmp(g_ssym_typeof.sz,prgch,0xc);
          if (iVar1 != 0) {
            return tkID;
          }
          *(byte *)pgrfid = (byte)*pgrfid | 1;
          *ptk = 0x34;
          return tkTYPEOF;
        }
        if (luHash == 0xa5727b8) {
          if (cch != 6) {
            return tkID;
          }
          iVar1 = bcmp(g_ssym_static.sz,prgch,0xc);
          if (iVar1 != 0) {
            return tkID;
          }
          *(byte *)pgrfid = (byte)*pgrfid | 2;
          *ptk = 0x4d;
          return tkID - isStrictMode;
        }
        if (luHash != 0xa5b93a2) {
          return tkID;
        }
        if (cch != 6) {
          return tkID;
        }
        iVar1 = bcmp(g_ssym_switch.sz,prgch,0xc);
        if (iVar1 != 0) {
          return tkID;
        }
        *(byte *)pgrfid = (byte)*pgrfid | 1;
        *ptk = 0x2c;
        return tkSWITCH;
      }
      if (0x9218cf1 < luHash) {
        if (luHash == 0x9218cf2) {
          if (cch != 6) {
            return tkID;
          }
          iVar1 = bcmp(g_ssym_ensure.sz,prgch,0xc);
          if (iVar1 != 0) {
            return tkID;
          }
          *ptk = 0x12;
          return tkID;
        }
        if (luHash < 0x9d3fe67) {
          if (luHash == 0x92e0b32) {
            if (cch != 6) {
              return tkID;
            }
            iVar1 = bcmp(g_ssym_export.sz,prgch,0xc);
            if (iVar1 != 0) {
              return tkID;
            }
            *(byte *)pgrfid = (byte)*pgrfid | 1;
            *ptk = 0x40;
            return tkEXPORT;
          }
          if (luHash != 0x976afab) {
            return tkID;
          }
          if (cch != 6) {
            return tkID;
          }
          iVar1 = bcmp(g_ssym_import.sz,prgch,0xc);
          if (iVar1 != 0) {
            return tkID;
          }
          *(byte *)pgrfid = (byte)*pgrfid | 1;
          *ptk = 0x42;
          return tkIMPORT;
        }
        if (luHash == 0x9d3fe67) {
          if (cch != 6) {
            return tkID;
          }
          iVar1 = bcmp(g_ssym_native.sz,prgch,0xc);
          if (iVar1 != 0) {
            return tkID;
          }
          *ptk = 0x24;
          return tkID;
        }
        if (luHash != 0xa17792f) {
          return tkID;
        }
        if (cch != 6) {
          return tkID;
        }
        iVar1 = bcmp(g_ssym_public.sz,prgch,0xc);
        if (iVar1 != 0) {
          return tkID;
        }
        *(byte *)pgrfid = (byte)*pgrfid | 2;
        *ptk = 0x4c;
        return (uint)!isStrictMode * 2 + tkPUBLIC;
      }
      if (luHash < 0x8ffd213) {
        if (luHash == 0xa28d67) {
          if (cch != 5) {
            return tkID;
          }
          iVar1 = bcmp(g_ssym_yield.sz,prgch,10);
          if (iVar1 != 0) {
            return tkID;
          }
          *(byte *)pgrfid = (byte)*pgrfid | 1;
          *ptk = 0x44;
          return tkYIELD;
        }
        if (luHash != 0x8d130f2) {
          return tkID;
        }
        if (cch != 6) {
          return tkID;
        }
        iVar1 = bcmp(g_ssym_assert.sz,prgch,0xc);
        if (iVar1 != 0) {
          return tkID;
        }
        *ptk = 2;
        return tkID;
      }
      if (luHash == 0x8ffd213) {
        if (cch != 6) {
          return tkID;
        }
        iVar1 = bcmp(g_ssym_delete.sz,prgch,0xc);
        if (iVar1 != 0) {
          return tkID;
        }
        *(byte *)pgrfid = (byte)*pgrfid | 1;
        *ptk = 0xe;
        return tkDELETE;
      }
      if (luHash != 0x90d396b) {
        return tkID;
      }
      if (cch != 6) {
        return tkID;
      }
      iVar1 = bcmp(g_ssym_double.sz,prgch,0xc);
      if (iVar1 != 0) {
        return tkID;
      }
      *ptk = 0x10;
      return tkID;
    }
    if (luHash == 0x70e47cd6) {
      if (cch != 8) {
        return tkID;
      }
      iVar1 = bcmp(g_ssym_function.sz,prgch,0x10);
      if (iVar1 != 0) {
        return tkID;
      }
      *(byte *)pgrfid = (byte)*pgrfid | 1;
      *ptk = 0x19;
      return tkFUNCTION;
    }
    if (luHash < 0xa9dee87c) {
      if (0x96f943ff < luHash) {
        if (luHash == 0x96f94400) {
          if (cch != 7) {
            return tkID;
          }
          iVar1 = bcmp(g_ssym_boolean.sz,prgch,0xe);
          if (iVar1 != 0) {
            return tkID;
          }
          *ptk = 4;
          return tkID;
        }
        if (luHash < 0x9c13124b) {
          if (luHash == 0x98f1bfff) {
            if (cch != 7) {
              return tkID;
            }
            iVar1 = bcmp(g_ssym_decimal.sz,prgch,0xe);
            if (iVar1 != 0) {
              return tkID;
            }
            *ptk = 0xc;
            return tkID;
          }
          if (luHash != 0x98f50305) {
            return tkID;
          }
          if (cch != 7) {
            return tkID;
          }
          iVar1 = bcmp(g_ssym_default.sz,prgch,0xe);
          if (iVar1 != 0) {
            return tkID;
          }
          *(byte *)pgrfid = (byte)*pgrfid | 1;
          *ptk = 0xd;
          return tkDEFAULT;
        }
        if (luHash == 0x9c13124b) {
          if (cch != 7) {
            return tkID;
          }
          iVar1 = bcmp(g_ssym_extends.sz,prgch,0xe);
          if (iVar1 != 0) {
            return tkID;
          }
          *(byte *)pgrfid = (byte)*pgrfid | 1;
          *ptk = 0x41;
          return tkEXTENDS;
        }
        if (luHash != 0x9c3672ef) {
          return tkID;
        }
        if (cch != 7) {
          return tkID;
        }
        iVar1 = bcmp(g_ssym_finally.sz,prgch,0xe);
        if (iVar1 != 0) {
          return tkID;
        }
        *(byte *)pgrfid = (byte)*pgrfid | 1;
        *ptk = 0x16;
        return tkFINALLY;
      }
      if (luHash < 0x856af30e) {
        if (luHash == 0x7679aa2a) {
          if (cch != 9) {
            return tkID;
          }
          iVar1 = bcmp(g_ssym_protected.sz,prgch,0x12);
          if (iVar1 != 0) {
            return tkID;
          }
          *(byte *)pgrfid = (byte)*pgrfid | 2;
          *ptk = 0x4b;
          return (uint)!isStrictMode + (uint)!isStrictMode * 2 + tkPROTECTED;
        }
        if (luHash != 0x79c146fa) {
          return tkID;
        }
        if (cch != 10) {
          return tkID;
        }
        iVar1 = bcmp(g_ssym_instanceof.sz,prgch,0x14);
        if (iVar1 != 0) {
          return tkID;
        }
        *(byte *)pgrfid = (byte)*pgrfid | 1;
        *ptk = 0x1e;
        return tkINSTANCEOF;
      }
      if (luHash == 0x856af30e) {
        if (cch != 10) {
          return tkID;
        }
        iVar1 = bcmp(g_ssym_implements.sz,prgch,0x14);
        if (iVar1 != 0) {
          return tkID;
        }
        *(byte *)pgrfid = (byte)*pgrfid | 2;
        *ptk = 0x46;
        return (uint)!isStrictMode * 8 + tkIMPLEMENTS;
      }
      if (luHash != 0x9309f69d) {
        return tkID;
      }
      if (cch != 9) {
        return tkID;
      }
      iVar1 = bcmp(g_ssym_namespace.sz,prgch,0x12);
      if (iVar1 != 0) {
        return tkID;
      }
      *ptk = 0x23;
      return tkID;
    }
    if (luHash == 0xa9dee87c) {
      if (cch != 7) {
        return tkID;
      }
      iVar1 = bcmp(g_ssym_package.sz,prgch,0xe);
      if (iVar1 != 0) {
        return tkID;
      }
      *(byte *)pgrfid = (byte)*pgrfid | 2;
      *ptk = 0x49;
      return (uint)!isStrictMode + (uint)!isStrictMode * 4 + tkPACKAGE;
    }
    if (0xbea8c42b < luHash) {
      if (luHash == 0xbea8c42c) {
        if (cch != 9) {
          return tkID;
        }
        iVar1 = bcmp(g_ssym_invariant.sz,prgch,0x12);
        if (iVar1 != 0) {
          return tkID;
        }
        *ptk = 0x21;
        return tkID;
      }
      if (luHash < 0xe10c0168) {
        if (luHash != 0xdbc60b24) {
          return tkID;
        }
        if (cch != 8) {
          return tkID;
        }
        iVar1 = bcmp(g_ssym_abstract.sz,prgch,0x10);
        if (iVar1 != 0) {
          return tkID;
        }
        *ptk = 1;
        return tkID;
      }
      if (luHash == 0xe10c0168) {
        if (cch != 9) {
          return tkID;
        }
        iVar1 = bcmp(g_ssym_transient.sz,prgch,0x12);
        if (iVar1 != 0) {
          return tkID;
        }
        *ptk = 0x31;
        return tkID;
      }
      if (luHash != 0xef691640) {
        return tkID;
      }
      if (cch != 8) {
        return tkID;
      }
      iVar1 = bcmp(g_ssym_volatile.sz,prgch,0x10);
      if (iVar1 != 0) {
        return tkID;
      }
      *ptk = 0x3b;
      return tkID;
    }
    if (luHash < 0xb0b68a3d) {
      if (luHash == 0xab57b15b) {
        if (cch != 7) {
          return tkID;
        }
        iVar1 = bcmp(g_ssym_private.sz,prgch,0xe);
        if (iVar1 != 0) {
          return tkID;
        }
        *(byte *)pgrfid = (byte)*pgrfid | 2;
        *ptk = 0x4a;
        return (uint)!isStrictMode * 4 + tkPRIVATE;
      }
      if (luHash != 0xad28d1bd) {
        return tkID;
      }
      if (cch != 7) {
        return tkID;
      }
      iVar1 = bcmp(g_ssym_require.sz,prgch,0xe);
      if (iVar1 != 0) {
        return tkID;
      }
      *ptk = 0x27;
      return tkID;
    }
    if (luHash == 0xb0b68a3d) {
      if (cch != 8) {
        return tkID;
      }
      iVar1 = bcmp(g_ssym_internal.sz,prgch,0x10);
      if (iVar1 != 0) {
        return tkID;
      }
      *ptk = 0x20;
      return tkID;
    }
    if (luHash != 0xbc1e9451) {
      return tkID;
    }
    if (cch != 9) {
      return tkID;
    }
    iVar1 = bcmp(g_ssym_interface.sz,prgch,0x12);
    if (iVar1 != 0) {
      return tkID;
    }
    *(byte *)pgrfid = (byte)*pgrfid | 2;
    *ptk = 0x47;
    tVar3 = tkINTERFACE;
  }
  tVar4 = tkID;
  if (isStrictMode) {
    tVar4 = tVar3;
  }
  return tVar4;
}

Assistant:

tokens Ident::TkFromNameLen(uint32 luHash, _In_reads_(cch) LPCOLESTR prgch, uint32 cch, bool isStrictMode, ushort * pgrfid, ushort * ptk)
{
    // look for a keyword
    #include "kwds_sw.h"

    #define KEYWORD(tk,f,prec2,nop2,prec1,nop1,name) \
    LEqual_##name: \
        if (cch == g_ssym_##name.cch && \
                0 == memcmp(g_ssym_##name.sz, prgch, cch * sizeof(OLECHAR))) \
        { \
            if (f) \
                *pgrfid |= f; \
            *ptk = tk; \
            return ((f & fidKwdRsvd) || (isStrictMode && (f & fidKwdFutRsvd))) ? tk : tkID; \
        } \
        goto LDefault;
    #include "keywords.h"

LDefault:
    return tkID;
}